

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int wait_until_context_ready(cubeb_conflict *ctx)

{
  pa_context_state_t x;
  int iVar1;
  long in_RDI;
  pa_context_state_t state;
  
  while( true ) {
    x = (*cubeb_pa_context_get_state)(*(pa_context **)(in_RDI + 0x18));
    iVar1 = PA_CONTEXT_IS_GOOD(x);
    if (iVar1 == 0) {
      return -1;
    }
    if (x == PA_CONTEXT_READY) break;
    (*cubeb_pa_threaded_mainloop_wait)(*(pa_threaded_mainloop **)(in_RDI + 0x10));
  }
  return 0;
}

Assistant:

static int
wait_until_context_ready(cubeb * ctx)
{
  for (;;) {
    pa_context_state_t state = WRAP(pa_context_get_state)(ctx->context);
    if (!PA_CONTEXT_IS_GOOD(state))
      return -1;
    if (state == PA_CONTEXT_READY)
      break;
    WRAP(pa_threaded_mainloop_wait)(ctx->mainloop);
  }
  return 0;
}